

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_group_norm(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  float fVar3;
  undefined1 auVar4 [64];
  int iVar5;
  int iVar6;
  ggml_tensor *pgVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  byte bVar32;
  byte bVar33;
  char cVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  char *pcVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  uint uVar47;
  long lVar48;
  undefined8 uVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  ulong uVar56;
  int np;
  uint uVar57;
  ushort uVar58;
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  float fVar63;
  double dVar64;
  undefined1 auVar65 [64];
  double dVar66;
  undefined1 auVar67 [64];
  double dVar68;
  long local_140;
  long local_138;
  long local_118;
  long local_110;
  long local_108;
  long local_f8;
  long local_e8;
  
  pgVar7 = dst->src[0];
  if (pgVar7->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xdb7,"fatal error");
  }
  cVar34 = ggml_are_same_shape();
  if (cVar34 == '\0') {
    pcVar42 = "ggml_are_same_shape(src0, dst)";
    uVar49 = 0xd65;
  }
  else {
    if (pgVar7->nb[0] == 4) {
      local_140 = (long)params->ith;
      iVar5 = dst->op_params[0];
      if (params->ith < iVar5) {
        lVar8 = pgVar7->ne[0];
        lVar9 = pgVar7->ne[1];
        lVar10 = pgVar7->ne[3];
        sVar11 = pgVar7->nb[1];
        sVar12 = pgVar7->nb[2];
        sVar13 = pgVar7->nb[3];
        sVar14 = dst->nb[1];
        sVar15 = dst->nb[2];
        sVar16 = dst->nb[3];
        fVar3 = (float)dst->op_params[1];
        iVar6 = (int)pgVar7->ne[2];
        iVar35 = (iVar6 + -1 + iVar5) / iVar5;
        uVar47 = (uint)lVar8;
        uVar57 = uVar47 & 0xffffffc0;
        lVar39 = (long)(int)uVar57;
        lVar46 = (long)(int)uVar47;
        if ((long)(int)uVar47 < lVar39 + 1) {
          lVar46 = lVar39 + 1;
        }
        auVar59 = vpbroadcastq_avx512f();
        lVar43 = (long)params->nth;
        lVar52 = (long)iVar35;
        local_108 = sVar12 * local_140 * lVar52;
        local_110 = sVar15 * local_140 * lVar52;
        lVar50 = sVar15 * lVar43 * lVar52;
        local_118 = local_110 + lVar39 * 4;
        auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar4 = vmovdqu64_avx512f(auVar59);
        do {
          if (0 < lVar10) {
            lVar44 = local_140 * lVar52;
            iVar36 = iVar35 + (int)lVar44;
            if (iVar6 <= iVar36) {
              iVar36 = iVar6;
            }
            lVar37 = (long)iVar36;
            dVar68 = (double)((lVar37 - lVar44) * lVar9 * lVar8);
            local_f8 = local_118;
            local_138 = local_110;
            lVar41 = 0;
            lVar54 = local_108;
            do {
              dVar64 = 0.0;
              auVar65 = ZEXT864(0) << 0x40;
              dVar66 = 0.0;
              lVar38 = lVar54;
              for (lVar40 = lVar44; lVar40 < lVar37; lVar40 = lVar40 + 1) {
                if (0 < lVar9) {
                  lVar45 = (long)pgVar7->data + lVar38;
                  lVar48 = 0;
                  do {
                    auVar67 = ZEXT864(0) << 0x40;
                    dVar66 = 0.0;
                    if (0 < lVar8) {
                      lVar51 = 0;
                      do {
                        dVar66 = auVar67._0_8_ + (double)*(float *)(lVar45 + lVar51 * 4);
                        auVar67 = ZEXT864((ulong)dVar66);
                        lVar51 = lVar51 + 1;
                      } while (lVar8 != lVar51);
                    }
                    auVar65 = ZEXT864((ulong)(auVar65._0_8_ + dVar66));
                    lVar48 = lVar48 + 1;
                    lVar45 = lVar45 + sVar11;
                  } while (lVar48 != lVar9);
                }
                dVar66 = auVar65._0_8_;
                lVar38 = lVar38 + sVar12;
              }
              if (lVar44 < lVar37) {
                auVar65 = ZEXT1664(ZEXT416(0) << 0x40);
                lVar40 = lVar54;
                lVar38 = local_138;
                lVar45 = lVar44;
                do {
                  if (0 < lVar9) {
                    lVar48 = (long)dst->data + lVar38;
                    lVar51 = (long)pgVar7->data + lVar40;
                    lVar53 = 0;
                    do {
                      auVar67 = ZEXT864(0) << 0x40;
                      dVar64 = 0.0;
                      if (0 < lVar8) {
                        lVar55 = 0;
                        do {
                          fVar63 = *(float *)(lVar51 + lVar55 * 4) - (float)(dVar66 / dVar68);
                          *(float *)(lVar48 + lVar55 * 4) = fVar63;
                          dVar64 = auVar67._0_8_ + (double)(fVar63 * fVar63);
                          auVar67 = ZEXT864((ulong)dVar64);
                          lVar55 = lVar55 + 1;
                        } while (lVar8 != lVar55);
                      }
                      auVar65 = ZEXT864((ulong)(auVar65._0_8_ + dVar64));
                      lVar53 = lVar53 + 1;
                      lVar48 = lVar48 + sVar14;
                      lVar51 = lVar51 + sVar11;
                    } while (lVar53 != lVar9);
                  }
                  dVar64 = auVar65._0_8_;
                  lVar45 = lVar45 + 1;
                  lVar38 = lVar38 + sVar15;
                  lVar40 = lVar40 + sVar12;
                } while (lVar45 < lVar37);
              }
              fVar63 = fVar3 + (float)(dVar64 / dVar68);
              if (fVar63 < 0.0) {
                fVar63 = sqrtf(fVar63);
                auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar59 = vmovdqu64_avx512f(auVar4);
              }
              else {
                auVar31 = vsqrtss_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63));
                fVar63 = auVar31._0_4_;
              }
              if (lVar44 < lVar37) {
                auVar65 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar63)));
                local_e8 = local_f8;
                lVar40 = local_138;
                lVar38 = lVar44;
                do {
                  if (0 < lVar9) {
                    lVar51 = 0;
                    lVar45 = local_e8;
                    lVar48 = lVar40;
                    do {
                      pvVar17 = dst->data;
                      if (0 < (int)uVar57) {
                        lVar53 = (long)pvVar17 + lVar48;
                        uVar56 = 0;
                        do {
                          lVar55 = 0;
                          do {
                            auVar67 = vmulps_avx512f(auVar65,*(undefined1 (*) [64])(lVar53 + lVar55)
                                                    );
                            *(undefined1 (*) [64])(lVar53 + lVar55) = auVar67;
                            lVar55 = lVar55 + 0x40;
                          } while (lVar55 != 0x100);
                          uVar56 = uVar56 + 0x40;
                          lVar53 = lVar53 + 0x100;
                        } while (uVar56 < uVar57);
                      }
                      if (uVar57 != uVar47) {
                        uVar56 = 0;
                        do {
                          auVar67 = vpbroadcastq_avx512f();
                          auVar62 = vporq_avx512f(auVar67,auVar60);
                          auVar67 = vporq_avx512f(auVar67,auVar61);
                          uVar49 = vpcmpuq_avx512f(auVar67,auVar59,2);
                          bVar32 = (byte)uVar49;
                          uVar49 = vpcmpuq_avx512f(auVar62,auVar59,2);
                          bVar33 = (byte)uVar49;
                          uVar58 = CONCAT11(bVar33,bVar32);
                          piVar1 = (int *)((long)pvVar17 + uVar56 * 4 + lVar45);
                          auVar67._4_4_ = (uint)((byte)(uVar58 >> 1) & 1) * piVar1[1];
                          auVar67._0_4_ = (uint)(bVar32 & 1) * *piVar1;
                          auVar67._8_4_ = (uint)((byte)(uVar58 >> 2) & 1) * piVar1[2];
                          auVar67._12_4_ = (uint)((byte)(uVar58 >> 3) & 1) * piVar1[3];
                          auVar67._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * piVar1[4];
                          auVar67._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * piVar1[5];
                          auVar67._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * piVar1[6];
                          auVar67._28_4_ = (uint)((byte)(uVar58 >> 7) & 1) * piVar1[7];
                          auVar67._32_4_ = (uint)(bVar33 & 1) * piVar1[8];
                          auVar67._36_4_ = (uint)(bVar33 >> 1 & 1) * piVar1[9];
                          auVar67._40_4_ = (uint)(bVar33 >> 2 & 1) * piVar1[10];
                          auVar67._44_4_ = (uint)(bVar33 >> 3 & 1) * piVar1[0xb];
                          auVar67._48_4_ = (uint)(bVar33 >> 4 & 1) * piVar1[0xc];
                          auVar67._52_4_ = (uint)(bVar33 >> 5 & 1) * piVar1[0xd];
                          auVar67._56_4_ = (uint)(bVar33 >> 6 & 1) * piVar1[0xe];
                          auVar67._60_4_ = (uint)(bVar33 >> 7) * piVar1[0xf];
                          auVar67 = vmulps_avx512f(auVar65,auVar67);
                          puVar2 = (uint *)((long)pvVar17 + uVar56 * 4 + lVar45);
                          bVar18 = (bool)((byte)(uVar58 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar58 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar58 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar58 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar58 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar58 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar58 >> 7) & 1);
                          bVar25 = (bool)(bVar33 >> 1 & 1);
                          bVar26 = (bool)(bVar33 >> 2 & 1);
                          bVar27 = (bool)(bVar33 >> 3 & 1);
                          bVar28 = (bool)(bVar33 >> 4 & 1);
                          bVar29 = (bool)(bVar33 >> 5 & 1);
                          bVar30 = (bool)(bVar33 >> 6 & 1);
                          *puVar2 = (uint)(bVar32 & 1) * auVar67._0_4_ |
                                    (uint)!(bool)(bVar32 & 1) * *puVar2;
                          puVar2[1] = (uint)bVar18 * auVar67._4_4_ | (uint)!bVar18 * puVar2[1];
                          puVar2[2] = (uint)bVar19 * auVar67._8_4_ | (uint)!bVar19 * puVar2[2];
                          puVar2[3] = (uint)bVar20 * auVar67._12_4_ | (uint)!bVar20 * puVar2[3];
                          puVar2[4] = (uint)bVar21 * auVar67._16_4_ | (uint)!bVar21 * puVar2[4];
                          puVar2[5] = (uint)bVar22 * auVar67._20_4_ | (uint)!bVar22 * puVar2[5];
                          puVar2[6] = (uint)bVar23 * auVar67._24_4_ | (uint)!bVar23 * puVar2[6];
                          puVar2[7] = (uint)bVar24 * auVar67._28_4_ | (uint)!bVar24 * puVar2[7];
                          puVar2[8] = (uint)(bVar33 & 1) * auVar67._32_4_ |
                                      (uint)!(bool)(bVar33 & 1) * puVar2[8];
                          puVar2[9] = (uint)bVar25 * auVar67._36_4_ | (uint)!bVar25 * puVar2[9];
                          puVar2[10] = (uint)bVar26 * auVar67._40_4_ | (uint)!bVar26 * puVar2[10];
                          puVar2[0xb] = (uint)bVar27 * auVar67._44_4_ | (uint)!bVar27 * puVar2[0xb];
                          puVar2[0xc] = (uint)bVar28 * auVar67._48_4_ | (uint)!bVar28 * puVar2[0xc];
                          puVar2[0xd] = (uint)bVar29 * auVar67._52_4_ | (uint)!bVar29 * puVar2[0xd];
                          puVar2[0xe] = (uint)bVar30 * auVar67._56_4_ | (uint)!bVar30 * puVar2[0xe];
                          puVar2[0xf] = (uint)(bVar33 >> 7) * auVar67._60_4_ |
                                        (uint)!(bool)(bVar33 >> 7) * puVar2[0xf];
                          uVar56 = uVar56 + 0x10;
                        } while (((lVar46 - lVar39) + 0xfU & 0xfffffffffffffff0) != uVar56);
                      }
                      lVar51 = lVar51 + 1;
                      lVar48 = lVar48 + sVar14;
                      lVar45 = lVar45 + sVar14;
                    } while (lVar51 != lVar9);
                  }
                  lVar38 = lVar38 + 1;
                  lVar40 = lVar40 + sVar15;
                  local_e8 = local_e8 + sVar15;
                } while (lVar38 < lVar37);
              }
              lVar41 = lVar41 + 1;
              lVar54 = lVar54 + sVar13;
              local_138 = local_138 + sVar16;
              local_f8 = local_f8 + sVar16;
            } while (lVar41 != lVar10);
          }
          local_140 = local_140 + lVar43;
          local_108 = local_108 + sVar12 * lVar43 * lVar52;
          local_110 = local_110 + lVar50;
          local_118 = local_118 + lVar50;
        } while (local_140 < iVar5);
      }
      return;
    }
    pcVar42 = "src0->nb[0] == sizeof(float)";
    uVar49 = 0xd67;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar49,"GGML_ASSERT(%s) failed",pcVar42);
}

Assistant:

void ggml_compute_forward_group_norm(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_group_norm_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}